

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O1

Array * __thiscall tf::UnboundedTaskQueue<void_*>::Array::resize(Array *this,int64_t b,int64_t t)

{
  long lVar1;
  Array *pAVar2;
  atomic<void_*> *paVar3;
  int64_t i;
  
  pAVar2 = (Array *)operator_new(0x18);
  lVar1 = this->C;
  pAVar2->C = lVar1 * 2;
  pAVar2->M = lVar1 * 2 + -1;
  paVar3 = (atomic<void_*> *)operator_new__(-(ulong)((ulong)(lVar1 * 2) >> 0x3d != 0) | lVar1 << 4);
  pAVar2->S = paVar3;
  if (t != b) {
    do {
      pAVar2->S[pAVar2->M & t]._M_b._M_p = this->S[this->M & t]._M_b._M_p;
      t = t + 1;
    } while (b != t);
  }
  return pAVar2;
}

Assistant:

Array* resize(int64_t b, int64_t t) {
      Array* ptr = new Array {2*C};
      for(int64_t i=t; i!=b; ++i) {
        ptr->push(i, pop(i));
      }
      return ptr;
    }